

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_Texture::IsTiled(ON_Texture *this,int dir,double *count,double *offset)

{
  double *pdVar1;
  int local_3c;
  int local_38;
  int col;
  int row;
  int row0;
  double *offset_local;
  double *count_local;
  int dir_local;
  ON_Texture *this_local;
  
  if (count != (double *)0x0) {
    *count = 1.0;
  }
  if (offset != (double *)0x0) {
    *offset = 0.0;
  }
  if ((-1 < dir) && (dir < 4)) {
    col = -1;
    for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
      local_3c = 0;
      while ((local_3c < 3 &&
             ((local_3c == dir ||
              ((pdVar1 = (this->m_uvw).m_xform[local_38] + local_3c, *pdVar1 == 0.0 &&
               (!NAN(*pdVar1)))))))) {
        local_3c = local_3c + 1;
      }
      if (local_3c == 3) {
        if (col != -1) {
          return false;
        }
        col = local_38;
      }
    }
    if (-1 < col) {
      if (count != (double *)0x0) {
        *count = (this->m_uvw).m_xform[col][dir];
      }
      if (offset != (double *)0x0) {
        *offset = (this->m_uvw).m_xform[col][3];
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Texture::IsTiled( int dir, double* count, double* offset ) const
{
  if ( count )
    *count = 1.0;
  if ( offset )
    *offset = 0.0;

  if ( 0 <= dir && dir <= 3 )
  {
    int row0=-1, row, col;
    for ( row = 0; row < 3; row++ )
    {
      for ( col = 0; col < 3; col++ )
      {
        if ( col != dir && 0.0 != m_uvw.m_xform[row][col] )
          break;
      }
      if ( 3 == col )
      {
        if ( -1 == row0 )
        {
          row0 = row;
        }
        else
          return false;
      }
    }
    if ( row0 >= 0 )
    {
      if (count)
        *count = m_uvw.m_xform[row0][dir];
      if ( offset )
        *offset = m_uvw.m_xform[row0][3];
      return true;
    }
  }

  return false;
}